

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

int main(void)

{
  U *pUVar1;
  _Atomic_word *p_Var2;
  weak_ptr<tf::Topology> *pwVar3;
  _Head_base<0UL,_tf::Node_*,_false> _Var4;
  _Head_base<0UL,_tf::Node_*,_false> _Var5;
  _Head_base<0UL,_tf::Node_*,_false> _Var6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  __native_type *this;
  Task C;
  Task D;
  Task B;
  Task A;
  Taskflow taskflow;
  Executor executor;
  Future<void> local_290;
  anon_class_1_0_00000001 local_269;
  _Head_base<0UL,_tf::Node_*,_false> local_268;
  _Head_base<0UL,_tf::Node_*,_false> local_260;
  _Head_base<0UL,_tf::Node_*,_false> local_258;
  _Head_base<0UL,_tf::Node_*,_false> local_250;
  shared_ptr<tf::WorkerInterface> local_248;
  anon_class_8_1_69701ed9 local_230;
  undefined1 local_228 [48];
  _Alloc_hider local_1f8;
  char local_1e8 [16];
  pointer local_1d8;
  pointer puStack_1d0;
  pointer local_1c8;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_1c0;
  bool local_168;
  __native_type local_160 [7];
  
  local_160[0]._0_8_ = &local_160[0].__data.__kind;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"Runtime Tasking","");
  local_228._8_8_ = 0;
  local_228._16_8_ = 0;
  local_228._24_8_ = 0;
  local_228._32_8_ = (__pthread_internal_list *)0x0;
  local_228._40_8_ = (__pthread_internal_list *)0x0;
  local_1f8._M_p = local_1e8;
  local_228._0_8_ =
       (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        *)&local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_160[0].__align,
             (undefined1 *)(local_160[0]._8_8_ + local_160[0].__align));
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1c8 = (pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8 = (pointer)0x0;
  puStack_1d0 = (pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_1c0,0);
  local_168 = false;
  if ((int *)local_160[0]._0_8_ != &local_160[0].__data.__kind) {
    operator_delete((void *)local_160[0]._0_8_,local_160[0]._16_8_ + 1);
  }
  uVar8 = std::thread::hardware_concurrency();
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor((Executor *)&local_160[0].__data,(ulong)uVar8,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  uVar10 = local_228._0_8_;
  local_250._M_head_impl = (Node *)0x0;
  local_258._M_head_impl = (Node *)0x0;
  local_268._M_head_impl = (Node *)0x0;
  local_260._M_head_impl = (Node *)0x0;
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_nstate = 0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name).field_2;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_string_length = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_data = (void *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_topology = (Topology *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_parent = (Node *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_num_successors = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_join_counter;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 0x10) = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x18) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:14:5)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x10) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:14:5)>
       ::_M_manager;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_handle).
  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ._M_index = '\x04';
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_exception_ptr)._M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar10,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_290);
  if ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_290,
               (Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  uVar7 = local_228._0_8_;
  _Var4._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar10)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_nstate = 0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name).field_2;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_string_length = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_data = (void *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_topology = (Topology *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_parent = (Node *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_num_successors = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_join_counter;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 0x10) = 0;
  *(_Head_base<0UL,_tf::Node_*,_false> **)
   &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = &local_268;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x18) =
       std::
       _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:15:5)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x10) =
       std::
       _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:15:5)>
       ::_M_manager;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_handle).
  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ._M_index = '\x02';
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_exception_ptr)._M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar7,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_290);
  if ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_290,
               (Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  uVar10 = local_228._0_8_;
  _Var5._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar7)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_nstate = 0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name).field_2;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_string_length = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_data = (void *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_topology = (Topology *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_parent = (Node *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_num_successors = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_join_counter;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 0x10) = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:19:5)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:19:5)>
       ::_M_manager;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_handle).
  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ._M_index = '\x01';
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_exception_ptr)._M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar10,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_290);
  if ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_290,
               (Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  uVar7 = local_228._0_8_;
  _Var6._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar10)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_nstate = 0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name).field_2;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_string_length = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_data = (void *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_topology = (Topology *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_parent = (Node *)0x0;
  ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_num_successors = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_join_counter;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 0x10) = 0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       = 0;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:20:5)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/runtime.cpp:20:5)>
       ::_M_manager;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_handle).
  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ._M_index = '\x01';
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false> =
       (_Head_base<0UL,_tf::Node::Semaphores_*,_false>)0x0;
  (((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_exception_ptr)._M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar7,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_290);
  if ((Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_290,
               (Node *)local_290.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  local_260._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar7)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  pwVar3 = &local_290._topology;
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar3;
  local_268._M_head_impl = _Var6._M_head_impl;
  local_258._M_head_impl = _Var5._M_head_impl;
  local_250._M_head_impl = _Var4._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"A","");
  std::__cxx11::string::_M_assign((string *)&(local_250._M_head_impl)->_name);
  if (local_290.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar3) {
    operator_delete(local_290.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_290._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"B","");
  std::__cxx11::string::_M_assign((string *)&(local_258._M_head_impl)->_name);
  if (local_290.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar3) {
    operator_delete(local_290.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_290._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"C","");
  std::__cxx11::string::_M_assign((string *)&(local_268._M_head_impl)->_name);
  if (local_290.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar3) {
    operator_delete(local_290.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_290._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  local_290.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"D","");
  std::__cxx11::string::_M_assign((string *)&(local_260._M_head_impl)->_name);
  if (local_290.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar3) {
    operator_delete(local_290.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_290._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
            ((Task *)&local_250,(Task *)&local_258,(Task *)&local_268,(Task *)&local_260);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"digraph Taskflow {\n",0x13);
  tf::Taskflow::_dump((Taskflow *)local_228,(ostream *)&std::cout,(Graph *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  local_230.repeat = 1;
  this = local_160;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            (&local_290,(Executor *)&this->__data,(Taskflow *)local_228,&local_230,&local_269);
  if (local_290.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    std::__future_base::_State_baseV2::wait
              (local_290.super_future<void>.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,this);
    if (local_290._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_290._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar9 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar9 = (local_290._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_290._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*(local_290._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_290.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_290.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    tf::Executor::~Executor((Executor *)&local_160[0].__data);
    tf::Taskflow::~Taskflow((Taskflow *)local_228);
    return 0;
  }
  uVar10 = std::__throw_future_error(3);
  tf::Executor::~Executor((Executor *)&local_160[0].__data);
  tf::Taskflow::~Taskflow((Taskflow *)local_228);
  _Unwind_Resume(uVar10);
}

Assistant:

int main() {

  tf::Taskflow taskflow("Runtime Tasking");
  tf::Executor executor;

  tf::Task A, B, C, D;

  std::tie(A, B, C, D) = taskflow.emplace(
    [] () { return 0; },
    [&C] (tf::Runtime& rt) {  // C must be captured by reference
      std::cout << "B\n";
      rt.schedule(C);
    },
    [] () { std::cout << "C\n"; },
    [] () { std::cout << "D\n"; }
  );

  // name tasks
  A.name("A");
  B.name("B");
  C.name("C");
  D.name("D");

  // create conditional dependencies
  A.precede(B, C, D);

  // dump the graph structure
  taskflow.dump(std::cout);

  // we will see both B and C in the output
  executor.run(taskflow).wait();

  return 0;
}